

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int detach_set_closed(DETACH_HANDLE detach,_Bool closed_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE closed_amqp_value;
  DETACH_INSTANCE *detach_instance;
  int result;
  _Bool closed_value_local;
  DETACH_HANDLE detach_local;
  
  if (detach == (DETACH_HANDLE)0x0) {
    detach_instance._0_4_ = 0x2513;
  }
  else {
    item_value = amqpvalue_create_boolean(closed_value);
    if (item_value == (AMQP_VALUE)0x0) {
      detach_instance._0_4_ = 0x251b;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(detach->composite_value,1,item_value);
      if (iVar1 == 0) {
        detach_instance._0_4_ = 0;
      }
      else {
        detach_instance._0_4_ = 0x2521;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)detach_instance;
}

Assistant:

int detach_set_closed(DETACH_HANDLE detach, bool closed_value)
{
    int result;

    if (detach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)detach;
        AMQP_VALUE closed_amqp_value = amqpvalue_create_boolean(closed_value);
        if (closed_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(detach_instance->composite_value, 1, closed_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(closed_amqp_value);
        }
    }

    return result;
}